

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<short,(char)44>
               (char *string_ptr,idx_t string_size,short *result,uint8_t width,uint8_t scale)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  undefined7 uVar6;
  ulong uVar4;
  ulong uVar5;
  uint uVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  duckdb *pdVar12;
  uint8_t uVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  short local_56;
  DecimalCastData<short> local_54;
  undefined4 local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_54.result = 0;
  local_54.excessive_decimals = '\0';
  local_54.exponent_type = NONE;
  local_54.digit_count = '\0';
  local_54.decimal_count = '\0';
  local_54.round_set = false;
  local_54.should_round = false;
  local_54.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) {
    return false;
  }
  uVar10 = 0;
  while ((bVar2 = string_ptr[uVar10], bVar2 - 9 < 5 || (bVar2 == 0x20))) {
    uVar10 = uVar10 + 1;
    if (string_size == uVar10) {
      return false;
    }
  }
  local_54.width = width;
  local_54.scale = scale;
  if (bVar2 == 0x2d) {
    if (string_size - 1 == uVar10) {
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_54);
      return false;
    }
    uVar14 = string_size - uVar10;
    uVar8 = 1;
    local_54.digit_count = 0;
    local_54.result = 0;
    do {
      bVar2 = string_ptr[uVar10 + uVar8];
      bVar15 = bVar2 - 0x30;
      if (9 < bVar15) {
        local_54._5_3_ = 0;
        uVar16 = uVar8;
        uVar13 = scale;
        if (bVar2 != 0x2c) goto LAB_00b8f961;
        uVar17 = uVar8 + 1;
        uVar9 = uVar17;
        if (uVar14 <= uVar17) goto LAB_00b8fa2e;
        local_48 = 0;
        local_44 = 0;
        local_54.decimal_count = 0;
        uVar4 = uVar17;
        uVar16 = uVar17;
        goto LAB_00b8f713;
      }
      if (bVar15 == 0 && local_54.result == 0) {
        local_54.result = 0;
      }
      else {
        if ((uint)width - (uint)scale == (uint)local_54.digit_count) {
          return false;
        }
        if (local_54.result < -0xccc) {
          return false;
        }
        local_54.digit_count = local_54.digit_count + 1;
        local_54.result = local_54.result * 10 - (ushort)bVar15;
      }
      uVar9 = uVar14;
      if (~uVar8 + string_size == uVar10) break;
      if (string_ptr[uVar10 + 1 + uVar8] == '_') {
        if ((string_size - uVar8) - 2 == uVar10) {
          return false;
        }
        uVar8 = uVar8 + 2;
        if (9 < (byte)(string_ptr[uVar10 + uVar8] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar8 = uVar8 + 1;
      }
      uVar9 = uVar8;
    } while (uVar8 < uVar14);
    local_54._5_3_ = 0;
    goto LAB_00b8f7cf;
  }
  if (bVar2 == 0x30 && string_size - 1 != uVar10) {
    bVar15 = string_ptr[uVar10 + 1];
    if (bVar15 < 0x62) {
      if ((bVar15 != 0x42) && (bVar15 != 0x58)) goto LAB_00b8f5e2;
    }
    else if ((bVar15 != 0x62) && (bVar15 != 0x78)) goto LAB_00b8f5e2;
    if ((string_size - uVar10) - 3 < 0xfffffffffffffffe) {
      return false;
    }
LAB_00b8f6b4:
    DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_54);
    return false;
  }
LAB_00b8f5e2:
  uVar8 = string_size - uVar10;
  uVar14 = (ulong)(bVar2 == 0x2b);
  if (uVar8 <= uVar14) goto LAB_00b8f6b4;
  local_54.digit_count = 0;
  local_54.result = 0;
  uVar16 = uVar14;
  do {
    bVar2 = string_ptr[uVar10 + uVar16];
    bVar15 = bVar2 - 0x30;
    if (9 < bVar15) {
      local_54._5_3_ = 0;
      uVar17 = uVar16;
      uVar13 = scale;
      if (bVar2 != 0x2c) goto LAB_00b8fa7d;
      uVar9 = uVar16 + 1;
      uVar4 = uVar9;
      if (uVar8 <= uVar9) goto LAB_00b8fb42;
      local_44 = (uint)local_54.digit_count;
      local_40 = local_40 & 0xffffffff00000000;
      local_48 = 0;
      local_54.decimal_count = 0;
      uVar5 = uVar9;
      uVar17 = uVar9;
      goto LAB_00b8f83d;
    }
    if (bVar15 == 0 && local_54.result == 0) {
      local_54.result = 0;
    }
    else {
      if ((uint)width - (uint)scale == (uint)local_54.digit_count) {
        return false;
      }
      if (0xccc < local_54.result) {
        return false;
      }
      local_54.digit_count = local_54.digit_count + 1;
      local_54.result = (ushort)bVar15 + local_54.result * 10;
    }
    uVar4 = uVar8;
    if (~uVar16 + string_size == uVar10) break;
    if (string_ptr[uVar10 + 1 + uVar16] == '_') {
      if ((string_size - uVar16) - 2 == uVar10) {
        return false;
      }
      uVar16 = uVar16 + 2;
      if (9 < (byte)(string_ptr[uVar10 + uVar16] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar16 = uVar16 + 1;
    }
    uVar4 = uVar16;
  } while (uVar16 < uVar8);
  local_54._5_3_ = 0;
  goto LAB_00b8f8fb;
LAB_00b8f713:
  bVar2 = string_ptr[uVar10 + uVar16];
  uVar6 = (undefined7)(uVar4 >> 8);
  bVar15 = bVar2 - 0x30;
  local_40 = uVar17;
  if (9 < bVar15) {
    local_54.round_set = local_44._0_1_;
    local_54.should_round = (bool)(char)local_48;
    uVar13 = uVar17 < uVar16 || 1 < uVar8;
    if (uVar17 >= uVar16 && 1 >= uVar8) {
      return false;
    }
LAB_00b8f961:
    uVar7 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar7 - 9) {
        return false;
      }
LAB_00b8f977:
      uVar16 = uVar16 + 1;
      uVar9 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((4 < (byte)string_ptr[uVar10 + uVar16] - 9) && (string_ptr[uVar10 + uVar16] != 0x20))
          {
            return false;
          }
          uVar16 = uVar16 + 1;
          uVar9 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_00b8f7cf;
    }
    if ((bVar2 != 0x65) && (uVar7 != 0x45)) {
      if (uVar7 != 0x20) {
        return false;
      }
      goto LAB_00b8f977;
    }
    if (uVar16 == 1) {
      return false;
    }
    if (uVar14 <= uVar16 + 1) {
      return false;
    }
    local_56 = 0;
    pdVar12 = (duckdb *)(string_ptr + uVar10 + uVar16 + 1);
    pcVar11 = (char *)(~uVar10 + (string_size - uVar16));
    if (*pdVar12 == (duckdb)0x2d) {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar12,pcVar11,(idx_t)&local_56,(IntegerCastData<short> *)(ulong)bVar2,
                         (bool)uVar13);
    }
    else {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar12,pcVar11,(idx_t)&local_56,(IntegerCastData<short> *)(ulong)bVar2,
                         (bool)uVar13);
    }
    if (bVar3 == false) {
      return false;
    }
    bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                      (&local_54,(int)local_56);
    goto LAB_00b8fb9d;
  }
  if ((local_54.decimal_count == scale) && (local_44._0_1_ == false)) {
    local_48 = (undefined4)CONCAT71(uVar6,4 < bVar15);
    local_44 = (uint)CONCAT71(uVar6,1);
  }
  bVar3 = (uint)local_54.decimal_count + (uint)local_54.digit_count < 4;
  sVar1 = local_54.result * 10 - (ushort)bVar15;
  if (!bVar3) {
    sVar1 = local_54.result;
  }
  local_54.result = sVar1;
  local_54.decimal_count = local_54.decimal_count + bVar3;
  uVar4 = ~uVar16 + string_size;
  uVar9 = uVar14;
  if (uVar4 != uVar10) goto code_r0x00b8f77c;
  goto LAB_00b8fa0e;
code_r0x00b8f77c:
  if (string_ptr[uVar10 + 1 + uVar16] == '_') {
    if ((string_size - uVar16) - 2 == uVar10) {
      return false;
    }
    uVar16 = uVar16 + 2;
    bVar2 = (string_ptr + uVar16)[uVar10] - 0x30;
    uVar4 = CONCAT71((int7)((ulong)(string_ptr + uVar16) >> 8),bVar2);
    if (9 < bVar2) {
      return false;
    }
  }
  else {
    uVar16 = uVar16 + 1;
  }
  uVar9 = uVar16;
  if (uVar14 <= uVar16) goto LAB_00b8fa0e;
  goto LAB_00b8f713;
LAB_00b8fa0e:
  local_54.round_set = SUB41(local_44,0);
  local_54.should_round = (bool)(char)local_48;
LAB_00b8fa2e:
  if ((uVar8 < 2) && (uVar9 <= uVar17)) {
    return false;
  }
LAB_00b8f7cf:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_54);
  if (!bVar3) {
    return false;
  }
  if (uVar9 < 2) {
    return false;
  }
  goto LAB_00b8f91a;
LAB_00b8f83d:
  bVar2 = string_ptr[uVar10 + uVar17];
  uVar6 = (undefined7)(uVar5 >> 8);
  bVar15 = bVar2 - 0x30;
  local_38 = uVar9;
  if (9 < bVar15) {
    local_54.round_set = local_48._0_1_;
    local_54.should_round = (bool)(char)local_40;
    uVar13 = uVar9 < uVar17 || uVar14 < uVar16;
    if (uVar9 >= uVar17 && uVar14 >= uVar16) {
      return false;
    }
LAB_00b8fa7d:
    uVar7 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar7 - 9) {
        return false;
      }
    }
    else {
      if ((bVar2 == 0x65) || (uVar7 == 0x45)) {
        if (uVar17 == uVar14) {
          return false;
        }
        if (uVar8 <= uVar17 + 1) {
          return false;
        }
        local_56 = 0;
        pdVar12 = (duckdb *)(string_ptr + uVar10 + uVar17 + 1);
        pcVar11 = (char *)(~uVar10 + (string_size - uVar17));
        if (*pdVar12 == (duckdb)0x2d) {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar12,pcVar11,(idx_t)&local_56,(IntegerCastData<short> *)(ulong)bVar2
                             ,(bool)uVar13);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar12,pcVar11,(idx_t)&local_56,(IntegerCastData<short> *)(ulong)bVar2
                             ,(bool)uVar13);
        }
        if (bVar3 == false) {
          return false;
        }
        bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                          (&local_54,(int)local_56);
LAB_00b8fb9d:
        if (bVar3 == false) {
          return false;
        }
        goto LAB_00b8f91a;
      }
      if (uVar7 != 0x20) {
        return false;
      }
    }
    uVar17 = uVar17 + 1;
    uVar4 = uVar17;
    if (uVar17 < uVar8) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar17] - 9) && (string_ptr[uVar10 + uVar17] != 0x20)) {
          return false;
        }
        uVar17 = uVar17 + 1;
        uVar4 = uVar8;
      } while (uVar8 != uVar17);
    }
    goto LAB_00b8f8fb;
  }
  if ((local_54.decimal_count == scale) && (local_48._0_1_ == false)) {
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71(uVar6,4 < bVar15));
    local_48 = (undefined4)CONCAT71(uVar6,1);
  }
  bVar3 = local_54.decimal_count + local_44 < 4;
  sVar1 = (ushort)bVar15 + local_54.result * 10;
  if (!bVar3) {
    sVar1 = local_54.result;
  }
  local_54.result = sVar1;
  local_54.decimal_count = local_54.decimal_count + bVar3;
  uVar5 = ~uVar17 + string_size;
  uVar4 = uVar8;
  if (uVar5 != uVar10) goto code_r0x00b8f8a8;
  goto LAB_00b8fb22;
code_r0x00b8f8a8:
  if (string_ptr[uVar10 + 1 + uVar17] == '_') {
    if ((string_size - uVar17) - 2 == uVar10) {
      return false;
    }
    uVar17 = uVar17 + 2;
    bVar2 = (string_ptr + uVar17)[uVar10] - 0x30;
    uVar5 = CONCAT71((int7)((ulong)(string_ptr + uVar17) >> 8),bVar2);
    if (9 < bVar2) {
      return false;
    }
  }
  else {
    uVar17 = uVar17 + 1;
  }
  uVar4 = uVar17;
  if (uVar8 <= uVar17) goto LAB_00b8fb22;
  goto LAB_00b8f83d;
LAB_00b8fb22:
  local_54.round_set = SUB41(local_48,0);
  local_54.should_round = (bool)(char)local_40;
LAB_00b8fb42:
  if ((uVar16 <= uVar14) && (uVar4 <= uVar9)) {
    return false;
  }
LAB_00b8f8fb:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_54);
  if (!bVar3) {
    return false;
  }
  if (uVar4 <= uVar14) {
    return false;
  }
LAB_00b8f91a:
  *result = local_54.result;
  return true;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}